

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_significand<fmt::v11::basic_appender<char>,char>
          (basic_appender<char> out,char *significand,int significand_size,int integral_size,
          char decimal_point)

{
  char c;
  basic_appender<char> *this;
  basic_appender<char> local_48;
  buffer<char> *local_40;
  buffer<char> *local_38;
  char local_29;
  int local_28;
  int iStack_24;
  char decimal_point_local;
  int integral_size_local;
  int significand_size_local;
  char *significand_local;
  basic_appender<char> out_local;
  
  local_40 = out.container;
  local_29 = decimal_point;
  local_28 = integral_size;
  iStack_24 = significand_size;
  _integral_size_local = significand;
  significand_local = (char *)out.container;
  local_38 = (buffer<char> *)
             copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                       (significand,significand + integral_size,out);
  c = local_29;
  out_local = (basic_appender<char>)local_38;
  if (local_29 != '\0') {
    significand_local = (char *)local_38;
    local_48 = basic_appender<char>::operator++((basic_appender<char> *)&significand_local,0);
    this = basic_appender<char>::operator*(&local_48);
    basic_appender<char>::operator=(this,c);
    out_local = copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                          (_integral_size_local + local_28,_integral_size_local + iStack_24,
                           (basic_appender<char>)significand_local);
  }
  return (basic_appender<char>)out_local.container;
}

Assistant:

FMT_CONSTEXPR auto write_significand(OutputIt out, const char* significand,
                                     int significand_size, int integral_size,
                                     Char decimal_point) -> OutputIt {
  out = detail::copy_noinline<Char>(significand, significand + integral_size,
                                    out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_noinline<Char>(significand + integral_size,
                                     significand + significand_size, out);
}